

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_card_mtr1.c
# Opt level: O1

int main(int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  void *__ptr;
  FILE *pFVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  byte *pbVar10;
  long lVar11;
  long lVar12;
  long local_80;
  
  if (argc < 2) {
    printf("Usage:\n\tmm_card mm_table_%02x.bin [outputfile.bin]\n",0x16);
    return -1;
  }
  pcVar3 = table_to_string('\x16');
  printf("Nortel Millennium %s Table %d (0x%02x) Dump\n\n",pcVar3,0x16,0x16);
  __ptr = calloc(1,0x294);
  if (__ptr == (void *)0x0) {
    printf("Failed to allocate %zu bytes.\n",0x294);
    return -0xc;
  }
  pFVar4 = fopen(argv[1],"rb");
  if (pFVar4 == (FILE *)0x0) {
    printf("Error opening %s\n",argv[1]);
    free(__ptr);
LAB_00104615:
    iVar2 = -2;
  }
  else {
    iVar2 = mm_validate_table_fsize('\x16',(FILE *)pFVar4,0x294);
    if (iVar2 == 0) {
      sVar5 = fread(__ptr,0x294,1,pFVar4);
      if (sVar5 == 1) {
        fclose(pFVar4);
        printf(
              "+-------------------------------------------------------+---------------+\n| Idx  | PAN St - End    | STD CD | Vfy | Carrier | Ref | P exp ini dis |\n+------+-----------------+--------+-----+---------+-----+---------------+"
              );
        lVar6 = (long)__ptr + 0xc;
        local_80 = (long)__ptr + 0x11;
        lVar7 = (long)__ptr + 0x19;
        lVar12 = (long)__ptr + 0xb;
        lVar11 = (long)__ptr + 0x15;
        uVar9 = 0;
        do {
          bVar1 = *(byte *)((long)__ptr + uVar9 * 0x21 + 6);
          if (bVar1 != 0) {
            pbVar10 = (byte *)(uVar9 * 0x21 + (long)__ptr);
            printf("\n|  %2d  | %02x%02x%02x - %02x%02x%02x | %s | x%02x |   0x%02x  | x%02x | P x%02x x%02x x%02x |"
                   ,uVar9 & 0xffffffff,(ulong)*pbVar10,(ulong)pbVar10[1],(ulong)pbVar10[2],
                   (ulong)pbVar10[3],(ulong)pbVar10[4],(ulong)pbVar10[5],
                   standard_cd_str[bVar1 & 0xf],(ulong)pbVar10[7],(ulong)pbVar10[0x20],
                   (ulong)pbVar10[0x1f],(ulong)pbVar10[8],(ulong)pbVar10[9],(ulong)pbVar10[10]);
            print_bits(pbVar10[7] ^ 4,str_vfy_flags);
            printf("\n|      | Service Codes: ");
            if (pbVar10[6] - 2 < 6) {
              lVar8 = 0;
              do {
                printf("%04x,",(ulong)*(ushort *)(lVar12 + lVar8 * 2));
                lVar8 = lVar8 + 1;
              } while (lVar8 != 5);
              printf("Spill: ");
              lVar8 = 0;
              do {
                printf("%02x,",(ulong)*(byte *)(lVar11 + lVar8));
                lVar8 = lVar8 + 1;
              } while (lVar8 != 8);
              printf(" TC:%02x ",(ulong)pbVar10[0x1d]);
              bVar1 = pbVar10[0x1e];
              pcVar3 = "DI:%02x |\n";
LAB_001044b4:
              printf(pcVar3,(ulong)bVar1);
            }
            else {
              if (pbVar10[6] == 10) {
                printf("Ck Digits: ");
                lVar8 = 0;
                do {
                  printf("%02x,",(ulong)*(byte *)(lVar6 + lVar8));
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 5);
                printf("     Ck Value: ");
                lVar8 = 0;
                do {
                  printf("%02x,",(ulong)*(byte *)(local_80 + lVar8));
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 8);
                printf(" |\n|      |                Manufacturer: ");
                lVar8 = 0;
                do {
                  printf("%02x,",(ulong)*(byte *)(lVar7 + lVar8));
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 5);
                bVar1 = pbVar10[0x1e];
                pcVar3 = "     Discount Index: %02x                 |\n";
                goto LAB_001044b4;
              }
              lVar8 = 0;
              do {
                printf("%02x,",(ulong)*(byte *)(lVar12 + lVar8));
                lVar8 = lVar8 + 1;
              } while (lVar8 != 0x14);
              puts("         |");
            }
            printf("+------+-----------------+--------+-----+---------+-----+---------------+");
          }
          uVar9 = uVar9 + 1;
          lVar6 = lVar6 + 0x21;
          local_80 = local_80 + 0x21;
          lVar7 = lVar7 + 0x21;
          lVar12 = lVar12 + 0x21;
          lVar11 = lVar11 + 0x21;
        } while (uVar9 != 0x14);
        putchar(10);
        if (argc != 3) {
          pFVar4 = (FILE *)0x0;
LAB_001046aa:
          *(undefined2 *)((long)__ptr + 0x1f) = 0x10;
          *(undefined2 *)((long)__ptr + 0x40) = 0x11;
          *(undefined2 *)((long)__ptr + 0x61) = 0x12;
          *(undefined2 *)((long)__ptr + 0x82) = 0x13;
          *(undefined2 *)((long)__ptr + 0xa3) = 0x14;
          *(undefined2 *)((long)__ptr + 0xc4) = 0x15;
          *(undefined2 *)((long)__ptr + 0xe5) = 0x16;
          *(undefined2 *)((long)__ptr + 0x106) = 0x17;
          *(undefined2 *)((long)__ptr + 0x127) = 0x18;
          *(undefined2 *)((long)__ptr + 0x148) = 0x19;
          *(undefined2 *)((long)__ptr + 0x169) = 0x1a;
          *(undefined2 *)((long)__ptr + 0x18a) = 0x1b;
          *(undefined2 *)((long)__ptr + 0x1ab) = 0x1c;
          *(undefined2 *)((long)__ptr + 0x1cc) = 0x1d;
          lVar6 = 7;
          do {
            *(byte *)((long)__ptr + lVar6) = *(byte *)((long)__ptr + lVar6) & 0x7f;
            lVar6 = lVar6 + 0x21;
          } while (lVar6 != 0x29b);
          if (pFVar4 == (FILE *)0x0) {
            iVar2 = 0;
          }
          else {
            iVar2 = 0;
            printf("\nWriting new table to %s\n",argv[2]);
            sVar5 = fwrite(__ptr,0x294,1,pFVar4);
            if (sVar5 != 1) {
              printf("Error writing output file %s\n",argv[2]);
              iVar2 = -5;
            }
            fclose(pFVar4);
          }
          free(__ptr);
          return iVar2;
        }
        pFVar4 = fopen(argv[2],"wb");
        if (pFVar4 != (FILE *)0x0) goto LAB_001046aa;
        printf("Error opening output file %s for write.\n",argv[2]);
        goto LAB_00104615;
      }
      pcVar3 = table_to_string('\x16');
      printf("Error reading %s table.\n",pcVar3);
    }
    free(__ptr);
    fclose(pFVar4);
    iVar2 = -5;
  }
  return iVar2;
}

Assistant:

int main(int argc, char *argv[]) {
    FILE *instream;
    FILE *ostream = NULL;
    int   index;
    int   j;
    int   ret = 0;

    dlog_mt_card_table_mtr1_t *ptable;

    if (argc <= 1) {
        printf("Usage:\n" \
               "\tmm_card mm_table_%02x.bin [outputfile.bin]\n", TABLE_ID);
        return -1;
    }

    printf("Nortel Millennium %s Table %d (0x%02x) Dump\n\n", table_to_string(TABLE_ID), TABLE_ID, TABLE_ID);

    ptable = (dlog_mt_card_table_mtr1_t *)calloc(1, sizeof(dlog_mt_card_table_mtr1_t));

    if (ptable == NULL) {
        printf("Failed to allocate %zu bytes.\n", sizeof(dlog_mt_card_table_mtr1_t));
        return -ENOMEM;
    }

    if ((instream = fopen(argv[1], "rb")) == NULL) {
        printf("Error opening %s\n", argv[1]);
        free(ptable);
        return -ENOENT;
    }

    if (mm_validate_table_fsize(TABLE_ID, instream, sizeof(dlog_mt_card_table_mtr1_t)) != 0) {
        free(ptable);
        fclose(instream);
        return -EIO;
    }

    if (fread(ptable, sizeof(dlog_mt_card_table_mtr1_t), 1, instream) != 1) {
        printf("Error reading %s table.\n", table_to_string(TABLE_ID));
        free(ptable);
        fclose(instream);
        return -EIO;
    }

    fclose(instream);

    printf("+-------------------------------------------------------+---------------+\n" \
           "| Idx  | PAN St - End    | STD CD | Vfy | Carrier | Ref | P exp ini dis |\n" \
           "+------+-----------------+--------+-----+---------+-----+---------------+");

    for (index = 0; index < CCARD_MAX_MTR1; index++) {
        card_entry_mtr1_t *pcard = &ptable->c[index];

        if (ptable->c[index].standard_cd == 0) continue;

        printf("\n|  %2d  | %02x%02x%02x - %02x%02x%02x | %s | x%02x |   0x%02x  | x%02x | P x%02x x%02x x%02x |",
               index,
               pcard->pan_start[0],
               pcard->pan_start[1],
               pcard->pan_start[2],
               pcard->pan_end[0],
               pcard->pan_end[1],
               pcard->pan_end[2],
               standard_cd_str[(pcard->standard_cd) & 0x0F],
               pcard->vfy_flags,
               pcard->carrier_ref,
               pcard->ref_num,
               pcard->p_exp_date,
               pcard->p_init_date,
               pcard->p_disc_data);

        print_bits((pcard->vfy_flags ^ CARD_VF_CALLING_CARD_IND), (char **)str_vfy_flags);

        printf("\n|      | Service Codes: ");

        switch (pcard->standard_cd) {
            case ansi:
            case aba:
            case cba:
            case boc:
            case ansi59:
            case ccitt:

                for (j = 0; j < SVC_CODE_MAX; j++) {
                    printf("%04x,", LE16(pcard->svc_code.cc.svc_code[j]));
                }
                printf("Spill: ");

                for (j = 0; j < SPILL_STRING_LEN; j++) {
                    printf("%02x,", pcard->svc_code.cc.spill_string[j]);
                }
                printf(" TC:%02x ",   pcard->svc_code.cc.term_char);
                printf("DI:%02x |\n", pcard->svc_code.cc.discount_index);
                break;
            case smcard:
                printf("Ck Digits: ");

                for (j = 0; j < SC_CHECK_DIGIT_LEN; j++) {
                    printf("%02x,", pcard->svc_code.sc.check_digits[j]);
                }
                printf("     Ck Value: ");

                for (j = 0; j < SC_CHECK_VALUE_LEN; j++) {
                    printf("%02x,", pcard->svc_code.sc.check_value[j]);
                }
                printf(" |\n|      |                Manufacturer: ");

                for (j = 0; j < SC_MANUF_LEN; j++) {
                    printf("%02x,", pcard->svc_code.sc.manufacturer[j]);
                }

                printf("     Discount Index: %02x                 |\n",
                       pcard->svc_code.sc.discount_index);

                break;
            default:

                for (j = 0; j < SERVICE_CODE_LEN; j++) {
                    printf("%02x,", pcard->svc_code.raw[j]);
                }
                printf("         |\n");
                break;
        }
        printf("+------+-----------------+--------+-----+---------+-----+---------------+");
    }

    printf("\n");

    if (argc == 3) {
        if ((ostream = fopen(argv[2], "wb")) == NULL) {
            printf("Error opening output file %s for write.\n", argv[2]);
            return -ENOENT;
        }
    }

    /* Update CARD table */
    ptable->c[0].carrier_ref  = 0x0;
    ptable->c[1].carrier_ref  = 0x0;
    ptable->c[2].carrier_ref  = 0x0;
    ptable->c[3].carrier_ref  = 0x0;
    ptable->c[4].carrier_ref  = 0x0;
    ptable->c[5].carrier_ref  = 0x0;
    ptable->c[6].carrier_ref  = 0x0;
    ptable->c[7].carrier_ref  = 0x0;
    ptable->c[8].carrier_ref  = 0x0;
    ptable->c[9].carrier_ref  = 0x0;
    ptable->c[10].carrier_ref = 0x0;
    ptable->c[11].carrier_ref = 0x0;
    ptable->c[12].carrier_ref = 0x0;
    ptable->c[13].carrier_ref = 0x0;

    ptable->c[0].ref_num = 0x10;
    ptable->c[1].ref_num = 0x11;
    ptable->c[2].ref_num = 0x12;
    ptable->c[3].ref_num = 0x13;
    ptable->c[4].ref_num = 0x14;
    ptable->c[5].ref_num = 0x15;
    ptable->c[6].ref_num = 0x16;
    ptable->c[7].ref_num = 0x17;
    ptable->c[8].ref_num = 0x18;
    ptable->c[9].ref_num = 0x19;
    ptable->c[10].ref_num = 0x1a;
    ptable->c[11].ref_num = 0x1b;
    ptable->c[12].ref_num = 0x1c;
    ptable->c[13].ref_num = 0x1d;

    for (index = 0; index < CCARD_MAX_MTR1; index++) {
        ptable->c[index].vfy_flags &= ~CARD_VF_ACCS_ROUTING;
    }

    /* If output file was specified, write it. */
    if (ostream != NULL) {
        printf("\nWriting new table to %s\n", argv[2]);

        if (fwrite(ptable, sizeof(dlog_mt_card_table_mtr1_t), 1, ostream) != 1) {
            printf("Error writing output file %s\n", argv[2]);
            ret = -EIO;
        }
        fclose(ostream);
    }

    if (ptable != NULL) {
        free(ptable);
    }

    return ret;
}